

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::TestVerifyUint32BigFieldNumber::_InternalSerialize
          (TestVerifyUint32BigFieldNumber *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  TestAllTypes *value;
  ulong uVar2;
  bool bVar3;
  anon_union_64_1_493b367e_for_TestVerifyUint32BigFieldNumber_3 aVar4;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes>_> *value_00;
  uint8_t *puVar5;
  uint uVar6;
  uint uVar7;
  int index;
  byte *pbVar8;
  
  aVar4 = this->field_0;
  if (((undefined1  [64])aVar4 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = (this->field_0)._impl_.optional_uint32_1_;
    *target = '\b';
    pbVar8 = target + 1;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar7;
    target = pbVar8 + 1;
  }
  if (((undefined1  [64])aVar4 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = (this->field_0)._impl_.optional_uint32_2_;
    *target = 0x10;
    pbVar8 = target + 1;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar7;
    target = pbVar8 + 1;
  }
  if (((undefined1  [64])aVar4 & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
    value = (this->field_0)._impl_.optional_all_types_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (9,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (iVar1 != 0) {
    index = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes>>
                           (&(this->field_0)._impl_.repeated_all_types_.super_RepeatedPtrFieldBase,
                            index);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (10,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  if (((undefined1  [64])aVar4 & (undefined1  [64])0x8) != (undefined1  [64])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = (this->field_0)._impl_.optional_uint32_63_;
    target[0] = 0xf8;
    target[1] = 3;
    pbVar8 = target + 2;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar7;
    target = pbVar8 + 1;
  }
  if (((undefined1  [64])aVar4 & (undefined1  [64])0x10) != (undefined1  [64])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = (this->field_0)._impl_.optional_uint32_64_;
    target[0] = 0x80;
    target[1] = 4;
    pbVar8 = target + 2;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar7;
    target = pbVar8 + 1;
  }
  if (((undefined1  [64])aVar4 & (undefined1  [64])0x40) != (undefined1  [64])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = (this->field_0)._impl_.optional_uint32_65_;
    target[0] = 0x88;
    target[1] = 4;
    pbVar8 = target + 2;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar7;
    target = pbVar8 + 1;
  }
  if (((undefined1  [64])aVar4 & (undefined1  [64])0x20) != (undefined1  [64])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = (this->field_0)._impl_.optional_uint32_1000_;
    target[0] = 0xc0;
    target[1] = 0x3e;
    pbVar8 = target + 2;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar7;
    target = pbVar8 + 1;
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestVerifyUint32BigFieldNumber::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestVerifyUint32BigFieldNumber& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestVerifyUint32BigFieldNumber)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // uint32 optional_uint32_1 = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        1, this_._internal_optional_uint32_1(), target);
  }

  // uint32 optional_uint32_2 = 2;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        2, this_._internal_optional_uint32_2(), target);
  }

  // .edition_unittest.TestAllTypes optional_all_types = 9;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.optional_all_types_, this_._impl_.optional_all_types_->GetCachedSize(), target,
        stream);
  }

  // repeated .edition_unittest.TestAllTypes repeated_all_types = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_all_types_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_all_types().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // uint32 optional_uint32_63 = 63;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        63, this_._internal_optional_uint32_63(), target);
  }

  // uint32 optional_uint32_64 = 64;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        64, this_._internal_optional_uint32_64(), target);
  }

  // uint32 optional_uint32_65 = 65;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        65, this_._internal_optional_uint32_65(), target);
  }

  // uint32 optional_uint32_1000 = 1000;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        1000, this_._internal_optional_uint32_1000(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestVerifyUint32BigFieldNumber)
  return target;
}